

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O3

void envy_bios_print_power_unk4c(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (bios->power).unk4c.offset;
  if ((mask >> 10 & 1) == 0 || uVar1 == 0) {
    return;
  }
  uVar2 = (ulong)(bios->power).unk4c.version;
  if ((bios->power).unk4c.valid != '\0') {
    fprintf((FILE *)out,"THERMAL ADJUSTMENT table at 0x%x, version %x\n",(ulong)uVar1,uVar2);
    envy_bios_dump_hex(bios,out,(bios->power).unk4c.offset,(uint)(bios->power).unk4c.hlen,mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    if ((bios->power).unk4c.entriesnum != '\0') {
      uVar2 = 0;
      do {
        envy_bios_dump_hex(bios,out,(bios->power).unk4c.entries[uVar2].offset,
                           (uint)(bios->power).unk4c.rlen,mask);
        if ((int)mask < 0) {
          fputc(10,(FILE *)out);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < (bios->power).unk4c.entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse THERMAL ADJUSTMENT table at 0x%x, version %x\n",(ulong)uVar1,
          uVar2);
  return;
}

Assistant:

void envy_bios_print_power_unk4c(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk4c *unk4c = &bios->power.unk4c;
	int i;

	if (!unk4c->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!unk4c->valid) {
		fprintf(out, "Failed to parse THERMAL ADJUSTMENT table at 0x%x, version %x\n", unk4c->offset, unk4c->version);
		return;
	}

	fprintf(out, "THERMAL ADJUSTMENT table at 0x%x, version %x\n", unk4c->offset, unk4c->version);
	envy_bios_dump_hex(bios, out, unk4c->offset, unk4c->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < unk4c->entriesnum; i++) {
		envy_bios_dump_hex(bios, out, unk4c->entries[i].offset, unk4c->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}